

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  QueryPlan *this;
  
  this = compileQuery();
  (*this->head_->_vptr_BaseOperator[2])();
  QueryPlan::printResultSet(this);
  (*this->head_->_vptr_BaseOperator[3])();
  operator_delete(this,8);
  return 0;
}

Assistant:

int main(int argc, char*argv[]) {
    QueryPlan *query_plan = compileQuery();
    // QueryPlan *query_plan = compileQueryWithJit();
    query_plan->open();
    query_plan->printResultSet();
    query_plan->close();
    delete query_plan;
}